

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  ImTextureID pvVar4;
  ImDrawCmd *__src;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ImDrawCmd *__dest;
  int iVar8;
  int iVar9;
  undefined1 in_ZMM1 [64];
  
  IVar1 = (this->_CmdHeader).ClipRect;
  auVar6 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
  auVar6 = vcmpps_avx((undefined1  [16])IVar1,auVar6,2);
  auVar5 = vshufps_avx(auVar6,auVar6,0x50);
  auVar6 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  if (((auVar6 & ~auVar5) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar6 & ~auVar5,0xf)) {
    pvVar4 = (this->_CmdHeader).TextureId;
    uVar2 = (this->_CmdHeader).VtxOffset;
    uVar3 = (this->IdxBuffer).Size;
    iVar7 = (this->CmdBuffer).Size;
    if (iVar7 == (this->CmdBuffer).Capacity) {
      if (iVar7 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar7 / 2 + iVar7;
      }
      iVar9 = iVar7 + 1;
      if (iVar7 + 1 < iVar8) {
        iVar9 = iVar8;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x38);
      __src = (this->CmdBuffer).Data;
      if (__src != (ImDrawCmd *)0x0) {
        memcpy(__dest,__src,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar9;
      iVar7 = (this->CmdBuffer).Size;
    }
    else {
      __dest = (this->CmdBuffer).Data;
    }
    __dest[iVar7].ClipRect = IVar1;
    __dest[iVar7].TextureId = pvVar4;
    __dest[iVar7].VtxOffset = uVar2;
    __dest[iVar7].IdxOffset = uVar3;
    *(undefined8 *)&__dest[iVar7].ElemCount = 0;
    *(ImDrawCallback *)(&__dest[iVar7].ElemCount + 2) = (ImDrawCallback)0x0;
    __dest[iVar7].UserCallbackData = (void *)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x1c1,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}